

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O0

void __thiscall
AmsRouter::AwaitConnectionAttempts
          (AmsRouter *this,AmsNetId *ams,unique_lock<std::recursive_mutex> *lock)

{
  anon_class_16_2_633b68f4 __p;
  unique_lock<std::recursive_mutex> *lock_local;
  AmsNetId *ams_local;
  AmsRouter *this_local;
  
  __p.ams = ams;
  __p.this = this;
  std::_V2::condition_variable_any::
  wait<std::unique_lock<std::recursive_mutex>,AmsRouter::AwaitConnectionAttempts(AmsNetId_const&,std::unique_lock<std::recursive_mutex>&)::__0>
            (&this->connection_attempt_events,lock,__p);
  return;
}

Assistant:

void AmsRouter::AwaitConnectionAttempts(const AmsNetId& ams, std::unique_lock<std::recursive_mutex>& lock)
{
    connection_attempt_events.wait(lock, [&]() { return connection_attempts.find(ams) == connection_attempts.end(); });
}